

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_199c2b::SwiftCompilerShellCommand::configureBool
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,bool *to,StringRef name,
          StringRef value)

{
  Child LHS;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  undefined1 uVar4;
  NodeKind NVar5;
  Child CVar6;
  Child CVar7;
  Child local_e8 [2];
  undefined2 local_d8;
  undefined6 uStack_d6;
  Child local_c8 [2];
  undefined2 local_b8;
  undefined6 uStack_b6;
  Twine local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  uint local_70;
  undefined4 uStack_6c;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  uint local_58;
  undefined4 uStack_54;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  uint local_40;
  undefined4 uStack_3c;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = (size_t)name.Data;
  if (value.Length == 5) {
    if (value.Data[4] != 'e' || *(int *)value.Data != 0x736c6166) goto LAB_00146fce;
    uVar4 = 0;
  }
  else {
    if ((value.Length != 4) || (*(int *)value.Data != 0x65757274)) {
LAB_00146fce:
      local_28.Data = to;
      llvm::Twine::Twine((Twine *)&local_40,"invalid value: \'",&value);
      llvm::Twine::Twine((Twine *)&local_58,"\' for attribute \'");
      if ((local_30 == NullKind) || (local_48 == NullKind)) {
        local_d8 = 0x100;
      }
      else if (local_30 == EmptyKind) {
        local_d8._1_1_ = cStack_47;
        local_d8._0_1_ = local_48;
        uStack_d6 = uStack_46;
        local_e8[0]._0_4_ = local_58;
        local_e8[0]._4_4_ = uStack_54;
      }
      else if (local_48 == EmptyKind) {
        local_d8._1_1_ = cStack_2f;
        local_d8._0_1_ = local_30;
        uStack_d6 = uStack_2e;
        local_e8[0]._0_4_ = local_40;
        local_e8[0]._4_4_ = uStack_3c;
      }
      else {
        CVar6._4_4_ = uStack_3c;
        CVar6.decUI = local_40;
        if (cStack_2f != '\x01') {
          local_30 = TwineKind;
          CVar6.twine = (Twine *)&local_40;
        }
        if (cStack_47 != '\x01') {
          local_48 = TwineKind;
        }
        CVar3._4_4_ = uStack_54;
        CVar3.decUI = local_58;
        CVar7.twine = (Twine *)&local_58;
        if (cStack_47 == '\x01') {
          CVar7 = CVar3;
        }
        llvm::Twine::Twine((Twine *)local_e8,CVar6,local_30,CVar7,local_48);
      }
      llvm::Twine::Twine((Twine *)&local_70,&local_28);
      if (((NodeKind)local_d8 == NullKind) || (local_60 == NullKind)) {
        local_b8 = 0x100;
      }
      else if ((NodeKind)local_d8 == EmptyKind) {
        local_b8._1_1_ = cStack_5f;
        local_b8._0_1_ = local_60;
        uStack_b6 = uStack_5e;
        local_c8[0]._0_4_ = local_70;
        local_c8[0]._4_4_ = uStack_6c;
      }
      else if (local_60 == EmptyKind) {
        local_b8._0_1_ = (NodeKind)local_d8;
        local_b8._1_1_ = local_d8._1_1_;
        uStack_b6 = uStack_d6;
        local_c8[0].decUI = local_e8[0].decUI;
        local_c8[0]._4_4_ = local_e8[0]._4_4_;
      }
      else {
        CVar7._4_4_ = local_e8[0]._4_4_;
        CVar7.decUI = local_e8[0].decUI;
        NVar5 = (NodeKind)local_d8;
        if (local_d8._1_1_ != EmptyKind) {
          CVar7.twine = (Twine *)local_e8;
          NVar5 = TwineKind;
        }
        if (cStack_5f != '\x01') {
          local_60 = TwineKind;
        }
        CVar2._4_4_ = uStack_6c;
        CVar2.decUI = local_70;
        CVar6.twine = (Twine *)&local_70;
        if (cStack_5f == '\x01') {
          CVar6 = CVar2;
        }
        llvm::Twine::Twine((Twine *)local_c8,CVar7,NVar5,CVar6,local_60);
      }
      llvm::Twine::Twine((Twine *)&local_88,"\'");
      if (((NodeKind)local_b8 == NullKind) || (local_78 == NullKind)) {
        local_a8._16_2_ = 0x100;
      }
      else if ((NodeKind)local_b8 == EmptyKind) {
        local_a8.RHSKind = cStack_77;
        local_a8.LHSKind = local_78;
        local_a8._18_6_ = uStack_76;
      }
      else if (local_78 == EmptyKind) {
        local_a8.LHSKind = (NodeKind)local_b8;
        local_a8.RHSKind = local_b8._1_1_;
        local_a8._18_6_ = uStack_b6;
      }
      else {
        LHS._4_4_ = local_c8[0]._4_4_;
        LHS.decUI = local_c8[0].decUI;
        NVar5 = (NodeKind)local_b8;
        if (local_b8._1_1_ != EmptyKind) {
          LHS.twine = (Twine *)local_c8;
          NVar5 = TwineKind;
        }
        if (cStack_77 != '\x01') {
          local_78 = TwineKind;
        }
        CVar1._4_4_ = uStack_84;
        CVar1.decUI = local_88;
        CVar6.twine = (Twine *)&local_88;
        if (cStack_77 == '\x01') {
          CVar6 = CVar1;
        }
        llvm::Twine::Twine(&local_a8,LHS,NVar5,CVar6,local_78);
      }
      llbuild::buildsystem::ConfigureContext::error((ConfigureContext *)this,&local_a8);
      return false;
    }
    uVar4 = 1;
  }
  *(undefined1 *)&ctx->delegate = uVar4;
  return true;
}

Assistant:

bool configureBool(const ConfigureContext& ctx, bool& to, StringRef name, StringRef value) {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
          name + "'");
      return false;
    }
    to = value == "true";
    return true;
  }